

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int minFreq;
  int binary;
  char *pcVar5;
  EVP_PKEY_CTX *ctx;
  real lr;
  Word2vec word2vec;
  char trainFile [200];
  char output [200];
  int local_254;
  int local_250;
  int local_248;
  int local_244;
  Word2vec local_240;
  EVP_PKEY_CTX local_1c8 [208];
  char local_f8 [200];
  
  local_1c8[0] = (EVP_PKEY_CTX)0x0;
  local_f8[0] = '\0';
  pcVar5 = parseArg("-size",argc,argv);
  if (pcVar5 == (char *)0x0) {
    iVar2 = 0x80;
  }
  else {
    iVar2 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-lr",argc,argv);
  if (pcVar5 == (char *)0x0) {
    lr = 0.05;
  }
  else {
    dVar1 = atof(pcVar5);
    lr = (real)dVar1;
  }
  pcVar5 = parseArg("-train",argc,argv);
  if (pcVar5 != (char *)0x0) {
    strcpy((char *)local_1c8,pcVar5);
  }
  pcVar5 = parseArg("-window",argc,argv);
  if (pcVar5 == (char *)0x0) {
    iVar3 = 5;
  }
  else {
    iVar3 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-cbow",argc,argv);
  if (pcVar5 == (char *)0x0) {
    iVar4 = 1;
  }
  else {
    iVar4 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-hs",argc,argv);
  if (pcVar5 == (char *)0x0) {
    local_244 = 0;
  }
  else {
    local_244 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-negative",argc,argv);
  if (pcVar5 == (char *)0x0) {
    local_248 = 10;
  }
  else {
    local_248 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-threads",argc,argv);
  if (pcVar5 == (char *)0x0) {
    local_250 = 1;
  }
  else {
    local_250 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-iter",argc,argv);
  if (pcVar5 == (char *)0x0) {
    local_254 = 5;
  }
  else {
    local_254 = atoi(pcVar5);
  }
  pcVar5 = parseArg("-output",argc,argv);
  if (pcVar5 != (char *)0x0) {
    strcpy(local_f8,pcVar5);
  }
  pcVar5 = parseArg("-min-count",argc,argv);
  if (pcVar5 == (char *)0x0) {
    minFreq = 5;
  }
  else {
    minFreq = atoi(pcVar5);
  }
  pcVar5 = parseArg("-binary",argc,argv);
  if (pcVar5 == (char *)0x0) {
    binary = 0;
  }
  else {
    binary = atoi(pcVar5);
  }
  if (local_1c8[0] == (EVP_PKEY_CTX)0x0) {
    pcVar5 = "no input file";
  }
  else {
    if (local_f8[0] != '\0') {
      printf("input file: %s\n",local_1c8);
      printf("output file: %s\n",local_f8);
      local_240.hs = local_244;
      local_240.negSample = local_248;
      local_240.vocab.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_240.vocab.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_240.vocab.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_240.word2idx._M_h._M_buckets = &local_240.word2idx._M_h._M_single_bucket;
      local_240.word2idx._M_h._M_bucket_count = 1;
      local_240.word2idx._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_240.word2idx._M_h._M_element_count = 0;
      local_240.word2idx._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_240.word2idx._M_h._M_rehash_policy._M_next_resize = 0;
      local_240.word2idx._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_240.embedding = (Embedding<float> *)0x0;
      local_240.outputLayer = (OutputLayer<float> *)0x0;
      ctx = local_1c8;
      local_240.embeddingSize = iVar2;
      local_240.cbow = iVar4;
      local_240.window = iVar3;
      Word2vec::buildVocab(&local_240,(char *)ctx,minFreq);
      Word2vec::init(&local_240,ctx);
      Word2vec::train(&local_240,(char *)local_1c8,local_254,local_250,lr);
      Word2vec::dump(&local_240,local_f8,binary);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_240.word2idx._M_h);
      std::vector<Word,_std::allocator<Word>_>::~vector(&local_240.vocab);
      return 0;
    }
    pcVar5 = "no output file";
  }
  puts(pcVar5);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
//    ProfilerStart("test_capture.prof");
    char trainFile[200];
    trainFile[0] = 0;
    char output[200];
    output[0] = 0;
    int embeddingSize = 128;
    float lr = 0.05;
    int window = 5;
    int cbow = 1;
    int hs = 0;
    int negative = 10;
    int threads = 1;
    int iter = 5;
    int minCount = 5;
    int binary = 0;
    char *tempArg;
    if ((tempArg = parseArg("-size", argc, argv)) != nullptr)
        embeddingSize = atoi(tempArg);
    if ((tempArg = parseArg("-lr", argc, argv)) != nullptr)
        lr = atof(tempArg);
    if ((tempArg = parseArg("-train", argc, argv)) != nullptr)
        strcpy(trainFile, tempArg);
    if ((tempArg = parseArg("-window", argc, argv)) != nullptr)
        window = atoi(tempArg);
    if ((tempArg = parseArg("-cbow", argc, argv)) != nullptr)
        cbow = atoi(tempArg);
    if ((tempArg = parseArg("-hs", argc, argv)) != nullptr)
        hs = atoi(tempArg);
    if ((tempArg = parseArg("-negative", argc, argv)) != nullptr)
        negative = atoi(tempArg);
    if ((tempArg = parseArg("-threads", argc, argv)) != nullptr)
        threads = atoi(tempArg);
    if ((tempArg = parseArg("-iter", argc, argv)) != nullptr)
        iter = atoi(tempArg);
    if ((tempArg = parseArg("-output", argc, argv)) != nullptr)
        strcpy(output, tempArg);
    if ((tempArg = parseArg("-min-count", argc, argv)) != nullptr)
        minCount = atoi(tempArg);
    if ((tempArg = parseArg("-binary", argc, argv)) != nullptr)
        binary = atoi(tempArg);
    if (strlen(trainFile) <= 0)
    {
        printf("no input file\n");
        return 0;
    }
    if (strlen(output) <= 0)
    {
        printf("no output file\n");
        return 0;
    }
    printf("input file: %s\n", trainFile);
    printf("output file: %s\n", output);
    Word2vec word2vec(embeddingSize, cbow, hs, window, negative);
    word2vec.buildVocab(trainFile, minCount);
    word2vec.init();
    word2vec.train(trainFile, iter, threads, lr);
    word2vec.dump(output, binary);
//    ProfilerStop();
}